

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::IMLE(IMLE<1,_1,_FastLinearExpert> *this,Param *prm,int pre_alloc)

{
  uint in_EDX;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  Param *in_stack_fffffffffffffef8;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_ffffffffffffff00;
  IMLE<1,_1,_FastLinearExpert> *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff10;
  Param *in_stack_ffffffffffffff40;
  
  Param::Param(in_stack_ffffffffffffff40);
  Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>::aligned_allocator_indirection
            ((aligned_allocator_indirection<FastLinearExpert<1,_1>_> *)0x235041);
  std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator<FastLinearExpert<1,_1>_>_>::vector
            ((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator<FastLinearExpert<1,_1>_>_> *)
             in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>::~aligned_allocator_indirection
            ((aligned_allocator_indirection<FastLinearExpert<1,_1>_> *)0x235067);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x23507d);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x235093);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x2350a9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2350c7);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffff10);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2351a0);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2351c6);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2351e8);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23520b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x235226);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x235248);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23526b);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23528d);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2352b0);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2352d2);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x2352f5);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x235317);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23533a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x235355);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x235377);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23539a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffff10);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x235428);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23544b);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x23546d);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_ffffffffffffff00,(allocator_type *)in_stack_fffffffffffffef8);
  Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::
  ~aligned_allocator_indirection
            ((aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x235490);
  this_00 = (IMLE<1,_1,_FastLinearExpert> *)&in_RDI->invPredictionsWeight;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2354ab);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x2354c1);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x2354d7);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x2354ed);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x235503);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x235519);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x23552f);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x235545);
  init(in_RDI,(EVP_PKEY_CTX *)(ulong)in_EDX);
  reset(this_00,in_stack_fffffffffffffef8);
  return;
}

Assistant:

IMLE_base::IMLE(Param const &prm, int pre_alloc)
#endif
{
    init( pre_alloc );
    reset(prm);
}